

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_plt_header(FILE *file,REF_INT *nvar,REF_LIST zone_type,REF_LIST zone_packing,
                   REF_LIST zone_nnode,REF_LIST zone_nelem)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  char *pcVar5;
  size_t sVar6;
  int maxlen;
  int maxlen_00;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar8;
  double dVar9;
  double dVar10;
  float zonemarker;
  int miscellaneous;
  int aux;
  int dim;
  int numelem;
  int neighbor;
  int location;
  int packing;
  int zonetype;
  int notused;
  int numvar;
  int filetype;
  int endian;
  char header [9];
  int auxiliary_value_format;
  int strand;
  int parent;
  double solutiontime;
  char auxvalue [1024];
  char auxname [1024];
  char zonename [1024];
  char varname [1024];
  char title [1024];
  float local_14c0;
  int local_14bc;
  int local_14b8;
  int local_14b4;
  int local_14b0;
  int local_14ac;
  REF_INT local_14a8;
  int local_14a4;
  int local_14a0;
  REF_INT local_149c;
  REF_INT local_1498;
  int local_1494;
  int local_1490;
  int local_148c;
  int local_1488;
  char local_1481 [4];
  undefined1 local_147d;
  undefined1 local_147c;
  REF_LIST local_1478;
  undefined8 uStack_1470;
  REF_LIST local_1468;
  REF_LIST local_1460;
  REF_LIST local_1458;
  undefined1 local_144c [4];
  undefined1 local_1448 [4];
  undefined1 local_1444 [4];
  undefined1 local_1440 [8];
  char local_1438 [1024];
  char local_1038 [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  local_1478 = zone_nelem;
  pcVar5 = fgets(local_1481,6,(FILE *)file);
  if (local_1481 == pcVar5) {
    local_147c = 0;
    local_1468 = zone_nnode;
    local_1460 = zone_packing;
    local_1458 = zone_type;
    iVar2 = strncmp(local_1481,"#!TDV",5);
    if (iVar2 == 0) {
      pcVar5 = fgets(local_1481,4,(FILE *)file);
      if (local_1481 != pcVar5) {
        pcVar5 = "version error";
        uVar7 = 0x91c;
        goto LAB_001619f3;
      }
      local_147d = 0;
      iVar2 = strncmp(local_1481,"112",5);
      if (iVar2 != 0) {
        sVar6 = (size_t)iVar2;
        pcVar5 = "expected version \'112\'";
        uVar7 = 0x91e;
        goto LAB_00161a5b;
      }
      sVar6 = fread(&local_1488,4,1,(FILE *)file);
      if (sVar6 == 1) {
        sVar6 = (size_t)local_1488;
        if (sVar6 == 1) {
          sVar6 = fread(&local_148c,4,1,(FILE *)file);
          if (sVar6 == 1) {
            sVar6 = (size_t)local_148c;
            if (sVar6 == 0) {
              uVar3 = ref_part_plt_string(file,local_438,maxlen);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x925,"ref_part_plt_header",(ulong)uVar3,"read title");
                return uVar3;
              }
              sVar6 = fread(&local_1490,4,1,(FILE *)file);
              if (sVar6 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x928,"ref_part_plt_header","numvar",1,sVar6);
                return 1;
              }
              *nvar = local_1490;
              local_14bc = local_1490;
              if (0 < local_1490) {
                uVar7 = extraout_RDX;
                iVar2 = local_1490;
                do {
                  RVar4 = ref_part_plt_string(file,local_838,(int)uVar7);
                  if (RVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x92d,"ref_part_plt_header",1,"read variable name");
                    return 1;
                  }
                  iVar2 = iVar2 + -1;
                  uVar7 = extraout_RDX_00;
                } while (iVar2 != 0);
              }
              sVar6 = fread(&local_14c0,4,1,(FILE *)file);
              if (sVar6 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x931,"ref_part_plt_header","zonemarker",1,sVar6);
                return 1;
              }
              uVar7 = extraout_RDX_01;
              while( true ) {
                fVar1 = 799.0 - local_14c0;
                if (fVar1 <= -fVar1) {
                  fVar1 = -fVar1;
                }
                if (1e-07 <= fVar1) break;
                RVar4 = ref_part_plt_string(file,local_1038,(int)uVar7);
                if (RVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x934,"ref_part_plt_header",1,"read auxname");
                  return 1;
                }
                sVar6 = fread(local_144c,4,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x937,"ref_part_plt_header","auxiliary_value_format",1,sVar6);
                  return 1;
                }
                RVar4 = ref_part_plt_string(file,local_1438,maxlen_00);
                if (RVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x938,"ref_part_plt_header",1,"read auxvalue");
                  return 1;
                }
                sVar6 = fread(&local_14c0,4,1,(FILE *)file);
                uVar7 = extraout_RDX_02;
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x93a,"ref_part_plt_header","zonemarker",1,sVar6);
                  return 1;
                }
              }
              while( true ) {
                dVar10 = (double)local_14c0;
                dVar9 = 299.0 - dVar10;
                if (dVar9 <= -dVar9) {
                  dVar9 = -dVar9;
                }
                if (1e-07 <= dVar9) {
                  local_1478 = (REF_LIST)(357.0 - dVar10);
                  if ((double)local_1478 <= -(double)local_1478) {
                    local_1478 = (REF_LIST)-(double)local_1478;
                  }
                  uStack_1470 = 0;
                  if (3.57e-10 < (double)local_1478) {
                    printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                           0x4076500000000000,dVar10,local_1478,0x3df888691125076a,
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x965,"ref_part_plt_header","end of header marker expected");
                  }
                  if (3.57e-10 < (double)local_1478) {
                    return 1;
                  }
                  return 0;
                }
                RVar4 = ref_part_plt_string(file,local_c38,(int)uVar7);
                if (RVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x93e,"ref_part_plt_header",1,"read zonename");
                  return 1;
                }
                sVar6 = fread(local_1444,4,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x941,"ref_part_plt_header","parent",1,sVar6);
                  return 1;
                }
                sVar6 = fread(local_1448,4,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x942,"ref_part_plt_header","strand",1,sVar6);
                  return 1;
                }
                sVar6 = fread(local_1440,8,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x943,"ref_part_plt_header","solutiontime",1,sVar6);
                  return 1;
                }
                sVar6 = fread(&local_1494,4,1,(FILE *)file);
                iVar2 = local_1494;
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x944,"ref_part_plt_header","notused",1,sVar6);
                  return 1;
                }
                if ((long)local_1494 != -1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x945,"ref_part_plt_header","not unused should be -1 plt",
                         0xffffffffffffffff,(long)local_1494);
                }
                if (iVar2 != -1) {
                  return 1;
                }
                sVar6 = fread(&local_1498,4,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x946,"ref_part_plt_header","zonetype",1,sVar6);
                  return 1;
                }
                uVar3 = ref_list_push(local_1458,local_1498);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x947,"ref_part_plt_header",(ulong)uVar3,"save zonetype");
                  return uVar3;
                }
                sVar6 = fread(&local_149c,4,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x948,"ref_part_plt_header","packing",1,sVar6);
                  return 1;
                }
                uVar3 = ref_list_push(local_1460,local_149c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x949,"ref_part_plt_header",(ulong)uVar3,"save packing");
                  return uVar3;
                }
                sVar6 = fread(&local_14a0,4,1,(FILE *)file);
                iVar2 = local_14a0;
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x94a,"ref_part_plt_header","location",1,sVar6);
                  return 1;
                }
                if ((long)local_14a0 != 0) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x94b,"ref_part_plt_header","only node data location plt implemented",0,
                         (long)local_14a0);
                }
                if (iVar2 != 0) {
                  return 1;
                }
                sVar6 = fread(&local_14a4,4,1,(FILE *)file);
                iVar2 = local_14a4;
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x94c,"ref_part_plt_header","neighbor",1,sVar6);
                  return 1;
                }
                if ((long)local_14a4 != 0) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x94d,"ref_part_plt_header","no face neighbor  plt implemented",0,
                         (long)local_14a4);
                }
                if (iVar2 != 0) break;
                local_14b8 = 0;
                if (-1 < local_14bc) {
                  iVar2 = 0;
                  do {
                    sVar6 = fread(&local_14b8,4,1,(FILE *)file);
                    if (sVar6 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x953,"ref_part_plt_header","mystery",1,sVar6);
                      return 1;
                    }
                  } while ((iVar2 < local_14bc) && (iVar2 = iVar2 + 1, local_14b8 == 0));
                }
                uVar3 = ref_list_push(local_1468,local_14b8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x957,"ref_part_plt_header",(ulong)uVar3,"save nnode");
                  return uVar3;
                }
                sVar6 = fread(&local_14a8,4,1,(FILE *)file);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x958,"ref_part_plt_header","numelem",1,sVar6);
                  return 1;
                }
                uVar3 = ref_list_push(local_1478,local_14a8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x959,"ref_part_plt_header",(ulong)uVar3,"save nelem");
                  return uVar3;
                }
                local_14b4 = 3;
                do {
                  sVar6 = fread(&local_14ac,4,1,(FILE *)file);
                  iVar2 = local_14ac;
                  if (sVar6 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x95c,"ref_part_plt_header","dim",1,sVar6);
                    return 1;
                  }
                  if ((long)local_14ac != 0) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x95d,"ref_part_plt_header","dim nonzero plt",0,(long)local_14ac);
                  }
                  if (iVar2 != 0) {
                    return 1;
                  }
                  local_14b4 = local_14b4 + -1;
                } while (local_14b4 != 0);
                sVar6 = fread(&local_14b0,4,1,(FILE *)file);
                iVar2 = local_14b0;
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x95f,"ref_part_plt_header","aux",1,sVar6);
                  return 1;
                }
                if ((long)local_14b0 != 0) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x960,"ref_part_plt_header","aux nonzero plt",0,(long)local_14b0);
                }
                if (iVar2 != 0) {
                  return 1;
                }
                sVar6 = fread(&local_14c0,4,1,(FILE *)file);
                uVar7 = extraout_RDX_03;
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x962,"ref_part_plt_header","zonemarker",1,sVar6);
                  return 1;
                }
              }
              return 1;
            }
            pcVar5 = "expected full filetype";
            uVar7 = 0x923;
            goto LAB_00161a5b;
          }
          pcVar5 = "filetype";
          uVar8 = 1;
          uVar7 = 0x922;
        }
        else {
          pcVar5 = "expected little endian plt";
          uVar8 = 1;
          uVar7 = 0x921;
        }
      }
      else {
        pcVar5 = "magic";
        uVar8 = 1;
        uVar7 = 0x920;
      }
    }
    else {
      sVar6 = (size_t)iVar2;
      pcVar5 = "header \'#!TDV\' missing";
      uVar7 = 0x91b;
LAB_00161a5b:
      uVar8 = 0;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
           "ref_part_plt_header",pcVar5,uVar8,sVar6);
  }
  else {
    pcVar5 = "header error";
    uVar7 = 0x919;
LAB_001619f3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
           "ref_part_plt_header",pcVar5);
  }
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_header(FILE *file, REF_INT *nvar,
                                              REF_LIST zone_type,
                                              REF_LIST zone_packing,
                                              REF_LIST zone_nnode,
                                              REF_LIST zone_nelem) {
  char header[9];
  int endian, filetype;
  char title[1024], varname[1024], zonename[1024];
  char auxname[1024], auxvalue[1024];
  int var, numvar;
  float zonemarker;
  int parent, strand, notused, zonetype, packing, location, neighbor;
  double solutiontime;
  int miscellaneous, i;
  int numpts, numelem;
  int dim, aux, auxiliary_value_format;
  REF_BOOL verbose = REF_FALSE;

  RAS(header == fgets(header, 6, file), "header error");
  header[5] = '\0';
  REIS(0, strncmp(header, "#!TDV", 5), "header '#!TDV' missing")
  RAS(header == fgets(header, 4, file), "version error");
  header[4] = '\0';
  REIS(0, strncmp(header, "112", 5), "expected version '112'")

  REIS(1, fread(&endian, sizeof(int), 1, file), "magic");
  REIS(1, endian, "expected little endian plt");
  REIS(1, fread(&filetype, sizeof(int), 1, file), "filetype");
  REIS(0, filetype, "expected full filetype");

  RSS(ref_part_plt_string(file, title, 1024), "read title");
  if (verbose) printf("plt title '%s'\n", title);

  REIS(1, fread(&numvar, sizeof(int), 1, file), "numvar");
  if (verbose) printf("plt number of variables %d\n", numvar);
  *nvar = numvar;

  for (var = 0; var < numvar; var++) {
    RSS(ref_part_plt_string(file, varname, 1024), "read variable name");
    if (verbose) printf("plt variable name %d '%s'\n", var, varname);
  }

  REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");

  while (ABS(799.0 - (double)zonemarker) < 1.0e-7) {
    RSS(ref_part_plt_string(file, auxname, 1024), "read auxname");
    if (verbose) printf("plt auxname '%s'\n", auxname);
    REIS(1, fread(&auxiliary_value_format, sizeof(int), 1, file),
         "auxiliary_value_format");
    RSS(ref_part_plt_string(file, auxvalue, 1024), "read auxvalue");
    if (verbose) printf("plt auxvalue '%s'\n", auxvalue);
    REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  }

  while (ABS(299.0 - (double)zonemarker) < 1.0e-7) {
    RSS(ref_part_plt_string(file, zonename, 1024), "read zonename");
    if (verbose) printf("plt zonename '%s'\n", zonename);

    REIS(1, fread(&parent, sizeof(int), 1, file), "parent");
    REIS(1, fread(&strand, sizeof(int), 1, file), "strand");
    REIS(1, fread(&solutiontime, sizeof(double), 1, file), "solutiontime");
    REIS(1, fread(&notused, sizeof(int), 1, file), "notused");
    REIS(-1, notused, "not unused should be -1 plt");
    REIS(1, fread(&zonetype, sizeof(int), 1, file), "zonetype");
    RSS(ref_list_push(zone_type, zonetype), "save zonetype");
    REIS(1, fread(&packing, sizeof(int), 1, file), "packing");
    RSS(ref_list_push(zone_packing, packing), "save packing");
    REIS(1, fread(&location, sizeof(int), 1, file), "location");
    REIS(0, location, "only node data location plt implemented");
    REIS(1, fread(&neighbor, sizeof(int), 1, file), "neighbor");
    REIS(0, neighbor, "no face neighbor  plt implemented");

    /* there seem to be numvar extra zeros in USM3D volume files */
    /* assume numpts is first nonzero */
    miscellaneous = 0;
    for (i = 0; (i < (numvar + 1)) && (0 == miscellaneous); i++) {
      REIS(1, fread(&miscellaneous, sizeof(int), 1, file), "mystery");
    }
    numpts = miscellaneous;

    RSS(ref_list_push(zone_nnode, numpts), "save nnode");
    REIS(1, fread(&numelem, sizeof(int), 1, file), "numelem");
    RSS(ref_list_push(zone_nelem, numelem), "save nelem");

    for (i = 0; i < 3; i++) {
      REIS(1, fread(&dim, sizeof(int), 1, file), "dim");
      REIS(0, dim, "dim nonzero plt");
    }
    REIS(1, fread(&aux, sizeof(int), 1, file), "aux");
    REIS(0, aux, "aux nonzero plt");

    REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  }

  RWDS(357.0, (double)zonemarker, -1.0, "end of header marker expected");

  return REF_SUCCESS;
}